

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::TestCase::TestCase
          (TestCase *this,funcType test,char *file,uint line,TestSuite *test_suite,String *type,
          int template_id)

{
  size_t sVar1;
  char *pcVar2;
  anon_union_24_2_13149d16_for_String_3 local_58;
  funcType local_40;
  String *local_38;
  
  (this->super_TestCaseData).m_file.field_0.buf[0] = '\0';
  (this->super_TestCaseData).m_file.field_0.buf[0x17] = '\x17';
  (this->m_type).field_0.buf[0] = '\0';
  (this->m_type).field_0.buf[0x17] = '\x17';
  (this->m_full_name).field_0.buf[0] = '\0';
  (this->m_full_name).field_0.buf[0x17] = '\x17';
  local_40 = test;
  local_38 = type;
  sVar1 = strlen(file);
  pcVar2 = String::allocate((String *)&local_58.data,(size_type)sVar1);
  memcpy(pcVar2,file,sVar1 & 0xffffffff);
  if (&local_58 != (anon_union_24_2_13149d16_for_String_3 *)this) {
    if (((this->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') &&
       (pcVar2 = (this->super_TestCaseData).m_file.field_0.data.ptr, pcVar2 != (char *)0x0)) {
      operator_delete__(pcVar2);
    }
    *(ulong *)((long)&(this->super_TestCaseData).m_file.field_0 + 0x10) =
         CONCAT17(local_58.buf[0x17],local_58._16_7_);
    (this->super_TestCaseData).m_file.field_0.data.ptr =
         (char *)CONCAT71(local_58._1_7_,local_58.buf[0]);
    *(undefined8 *)((long)&(this->super_TestCaseData).m_file.field_0 + 8) = local_58._8_8_;
    local_58.buf[0] = '\0';
    local_58.buf[0x17] = '\x17';
  }
  if ((local_58.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_58._1_7_,local_58.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_58._1_7_,local_58.buf[0]));
  }
  (this->super_TestCaseData).m_line = line;
  (this->super_TestCaseData).m_name = (char *)0x0;
  (this->super_TestCaseData).m_test_suite = test_suite->m_test_suite;
  (this->super_TestCaseData).m_description = test_suite->m_description;
  (this->super_TestCaseData).m_skip = test_suite->m_skip;
  (this->super_TestCaseData).m_no_breaks = test_suite->m_no_breaks;
  (this->super_TestCaseData).m_no_output = test_suite->m_no_output;
  (this->super_TestCaseData).m_may_fail = test_suite->m_may_fail;
  (this->super_TestCaseData).m_should_fail = test_suite->m_should_fail;
  (this->super_TestCaseData).m_expected_failures = test_suite->m_expected_failures;
  (this->super_TestCaseData).m_timeout = test_suite->m_timeout;
  this->m_test = local_40;
  String::operator=(&this->m_type,local_38);
  this->m_template_id = template_id;
  return;
}

Assistant:

TestCase::TestCase(funcType test, const char* file, unsigned line, const TestSuite& test_suite,
                       const String& type, int template_id) {
        m_file              = file;
        m_line              = line;
        m_name              = nullptr; // will be later overridden in operator*
        m_test_suite        = test_suite.m_test_suite;
        m_description       = test_suite.m_description;
        m_skip              = test_suite.m_skip;
        m_no_breaks         = test_suite.m_no_breaks;
        m_no_output         = test_suite.m_no_output;
        m_may_fail          = test_suite.m_may_fail;
        m_should_fail       = test_suite.m_should_fail;
        m_expected_failures = test_suite.m_expected_failures;
        m_timeout           = test_suite.m_timeout;

        m_test        = test;
        m_type        = type;
        m_template_id = template_id;
    }